

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_sha2_perform_all_rounds(fio_sha2_s *s,uint8_t *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  long lVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  ulong uVar96;
  ulong uVar97;
  ulong uVar98;
  ulong uVar99;
  uint32_t w_1 [64];
  uint32_t t2_1;
  uint32_t t1_1;
  uint32_t h_1;
  uint32_t g_1;
  uint32_t f_1;
  uint32_t e_1;
  uint32_t d_1;
  uint32_t c_1;
  uint32_t b_1;
  uint32_t a_1;
  uint64_t w [80];
  uint64_t t2;
  uint64_t t1;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint8_t *data_local;
  fio_sha2_s *s_local;
  
  if ((s->type & SHA_512) == 0) {
    uVar41 = (s->digest).i32[0];
    uVar39 = (s->digest).i32[1];
    uVar37 = (s->digest).i32[2];
    uVar42 = (s->digest).i32[4];
    uVar40 = (s->digest).i32[5];
    uVar1 = (uint)*data << 0x18 | (uint)data[1] << 0x10 | (uint)data[2] << 8 | (uint)data[3];
    uVar2 = (uint)data[4] << 0x18 | (uint)data[5] << 0x10;
    uVar3 = uVar2 | (uint)data[6] << 8 | (uint)data[7];
    uVar4 = (uint)data[8] << 0x18 | (uint)data[9] << 0x10;
    uVar5 = uVar4 | (uint)data[10] << 8 | (uint)data[0xb];
    uVar6 = (uint)data[0xc] << 0x18 | (uint)data[0xd] << 0x10;
    uVar7 = uVar6 | (uint)data[0xe] << 8 | (uint)data[0xf];
    uVar8 = (uint)data[0x10] << 0x18 | (uint)data[0x11] << 0x10;
    uVar9 = uVar8 | (uint)data[0x12] << 8 | (uint)data[0x13];
    uVar10 = (uint)data[0x14] << 0x18 | (uint)data[0x15] << 0x10;
    uVar11 = uVar10 | (uint)data[0x16] << 8 | (uint)data[0x17];
    uVar12 = (uint)data[0x18] << 0x18 | (uint)data[0x19] << 0x10;
    uVar13 = uVar12 | (uint)data[0x1a] << 8 | (uint)data[0x1b];
    uVar14 = (uint)data[0x1c] << 0x18 | (uint)data[0x1d] << 0x10;
    uVar15 = uVar14 | (uint)data[0x1e] << 8 | (uint)data[0x1f];
    uVar16 = (uint)data[0x20] << 0x18 | (uint)data[0x21] << 0x10;
    uVar17 = uVar16 | (uint)data[0x22] << 8 | (uint)data[0x23];
    uVar18 = (uint)data[0x24] << 0x18 | (uint)data[0x25] << 0x10;
    uVar19 = uVar18 | (uint)data[0x26] << 8 | (uint)data[0x27];
    uVar20 = (uint)data[0x28] << 0x18 | (uint)data[0x29] << 0x10;
    uVar21 = uVar20 | (uint)data[0x2a] << 8 | (uint)data[0x2b];
    uVar22 = (uint)data[0x2c] << 0x18 | (uint)data[0x2d] << 0x10;
    uVar23 = uVar22 | (uint)data[0x2e] << 8 | (uint)data[0x2f];
    uVar24 = (uint)data[0x30] << 0x18 | (uint)data[0x31] << 0x10;
    uVar25 = uVar24 | (uint)data[0x32] << 8 | (uint)data[0x33];
    uVar26 = (uint)data[0x34] << 0x18 | (uint)data[0x35] << 0x10;
    uVar27 = uVar26 | (uint)data[0x36] << 8 | (uint)data[0x37];
    uVar28 = (uint)data[0x38] << 0x18 | (uint)data[0x39] << 0x10;
    uVar29 = uVar28 | (uint)data[0x3a] << 8;
    uVar30 = uVar29 | data[0x3b];
    uVar31 = (uint)data[0x3c] << 0x18 | (uint)data[0x3d] << 0x10;
    uVar32 = uVar31 | (uint)data[0x3e] << 8;
    uVar33 = uVar32 | data[0x3f];
    iVar34 = (s->digest).i32[7] +
             ((uVar42 >> 6 | uVar42 << 0x1a) ^ (uVar42 >> 0xb | uVar42 << 0x15) ^
             (uVar42 >> 0x19 | uVar42 << 7)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & (s->digest).i32[6]) + sha2_256_words[0] +
             uVar1;
    uVar35 = (s->digest).i32[3] + iVar34;
    uVar36 = iVar34 + ((uVar41 >> 2 | uVar41 << 0x1e) ^ (uVar41 >> 0xd | uVar41 << 0x13) ^
                      (uVar41 >> 0x16 | uVar41 << 10)) +
                      (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    iVar34 = (s->digest).i32[6] +
             ((uVar35 >> 6 | uVar35 * 0x4000000) ^ (uVar35 >> 0xb | uVar35 * 0x200000) ^
             (uVar35 >> 0x19 | uVar35 * 0x80)) + (uVar35 & uVar42 ^ (uVar35 ^ 0xffffffff) & uVar40)
             + sha2_256_words[1] + uVar3;
    uVar37 = uVar37 + iVar34;
    uVar38 = iVar34 + ((uVar36 >> 2 | uVar36 * 0x40000000) ^ (uVar36 >> 0xd | uVar36 * 0x80000) ^
                      (uVar36 >> 0x16 | uVar36 * 0x400)) +
                      (uVar36 & uVar41 ^ uVar36 & uVar39 ^ uVar41 & uVar39);
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar35 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[2] + uVar5;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar38 >> 2 | uVar38 * 0x40000000) ^ (uVar38 >> 0xd | uVar38 * 0x80000) ^
                      (uVar38 >> 0x16 | uVar38 * 0x400)) +
                      (uVar38 & uVar36 ^ uVar38 & uVar41 ^ uVar36 & uVar41);
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar35) + sha2_256_words[3] + uVar7;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar38 ^ uVar40 & uVar36 ^ uVar38 & uVar36);
    iVar34 = uVar35 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                      (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[4] + uVar9;
    uVar36 = uVar36 + iVar34;
    uVar35 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                      (uVar42 >> 0x16 | uVar42 * 0x400)) +
                      (uVar42 & uVar40 ^ uVar42 & uVar38 ^ uVar40 & uVar38);
    iVar34 = uVar37 + ((uVar36 >> 6 | uVar36 * 0x4000000) ^ (uVar36 >> 0xb | uVar36 * 0x200000) ^
                      (uVar36 >> 0x19 | uVar36 * 0x80)) +
             (uVar36 & uVar41 ^ (uVar36 ^ 0xffffffff) & uVar39) + sha2_256_words[5] + uVar11;
    uVar38 = uVar38 + iVar34;
    uVar37 = iVar34 + ((uVar35 >> 2 | uVar35 * 0x40000000) ^ (uVar35 >> 0xd | uVar35 * 0x80000) ^
                      (uVar35 >> 0x16 | uVar35 * 0x400)) +
                      (uVar35 & uVar42 ^ uVar35 & uVar40 ^ uVar42 & uVar40);
    iVar34 = uVar39 + ((uVar38 >> 6 | uVar38 * 0x4000000) ^ (uVar38 >> 0xb | uVar38 * 0x200000) ^
                      (uVar38 >> 0x19 | uVar38 * 0x80)) +
             (uVar38 & uVar36 ^ (uVar38 ^ 0xffffffff) & uVar41) + sha2_256_words[6] + uVar13;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar35 ^ uVar37 & uVar42 ^ uVar35 & uVar42);
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar38 ^ (uVar40 ^ 0xffffffff) & uVar36) + sha2_256_words[7] + uVar15;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar35 ^ uVar37 & uVar35);
    iVar34 = uVar36 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                      (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar38) + sha2_256_words[8] + uVar17;
    uVar35 = uVar35 + iVar34;
    uVar36 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                      (uVar41 >> 0x16 | uVar41 * 0x400)) +
                      (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    iVar34 = uVar38 + ((uVar35 >> 6 | uVar35 * 0x4000000) ^ (uVar35 >> 0xb | uVar35 * 0x200000) ^
                      (uVar35 >> 0x19 | uVar35 * 0x80)) +
             (uVar35 & uVar42 ^ (uVar35 ^ 0xffffffff) & uVar40) + sha2_256_words[9] + uVar19;
    uVar37 = uVar37 + iVar34;
    uVar38 = iVar34 + ((uVar36 >> 2 | uVar36 * 0x40000000) ^ (uVar36 >> 0xd | uVar36 * 0x80000) ^
                      (uVar36 >> 0x16 | uVar36 * 0x400)) +
                      (uVar36 & uVar41 ^ uVar36 & uVar39 ^ uVar41 & uVar39);
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar35 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[10] + uVar21;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar38 >> 2 | uVar38 * 0x40000000) ^ (uVar38 >> 0xd | uVar38 * 0x80000) ^
                      (uVar38 >> 0x16 | uVar38 * 0x400)) +
                      (uVar38 & uVar36 ^ uVar38 & uVar41 ^ uVar36 & uVar41);
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar35) + sha2_256_words[0xb] + uVar23;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar38 ^ uVar40 & uVar36 ^ uVar38 & uVar36);
    iVar34 = uVar35 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                      (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0xc] + uVar25;
    uVar36 = uVar36 + iVar34;
    uVar35 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                      (uVar42 >> 0x16 | uVar42 * 0x400)) +
                      (uVar42 & uVar40 ^ uVar42 & uVar38 ^ uVar40 & uVar38);
    iVar34 = uVar37 + ((uVar36 >> 6 | uVar36 * 0x4000000) ^ (uVar36 >> 0xb | uVar36 * 0x200000) ^
                      (uVar36 >> 0x19 | uVar36 * 0x80)) +
             (uVar36 & uVar41 ^ (uVar36 ^ 0xffffffff) & uVar39) + sha2_256_words[0xd] + uVar27;
    uVar38 = uVar38 + iVar34;
    uVar37 = iVar34 + ((uVar35 >> 2 | uVar35 * 0x40000000) ^ (uVar35 >> 0xd | uVar35 * 0x80000) ^
                      (uVar35 >> 0x16 | uVar35 * 0x400)) +
                      (uVar35 & uVar42 ^ uVar35 & uVar40 ^ uVar42 & uVar40);
    iVar34 = uVar39 + ((uVar38 >> 6 | uVar38 * 0x4000000) ^ (uVar38 >> 0xb | uVar38 * 0x200000) ^
                      (uVar38 >> 0x19 | uVar38 * 0x80)) +
             (uVar38 & uVar36 ^ (uVar38 ^ 0xffffffff) & uVar41) + sha2_256_words[0xe] + uVar30;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar35 ^ uVar37 & uVar42 ^ uVar35 & uVar42);
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar38 ^ (uVar40 ^ 0xffffffff) & uVar36) + sha2_256_words[0xf] + uVar33;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar35 ^ uVar37 & uVar35);
    uVar1 = ((uVar28 >> 0x11 | uVar30 << 0xf) ^ (uVar28 >> 0x13 | uVar30 << 0xd) ^ uVar29 >> 10) +
            uVar19 + ((uVar3 >> 7 | (uint)data[7] << 0x19) ^ (uVar2 >> 0x12 | uVar3 << 0xe) ^
                     uVar3 >> 3) + uVar1;
    iVar34 = uVar36 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                      (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar38) + sha2_256_words[0x10] + uVar1;
    uVar35 = uVar35 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar3 = ((uVar31 >> 0x11 | uVar33 << 0xf) ^ (uVar31 >> 0x13 | uVar33 << 0xd) ^ uVar32 >> 10) +
            uVar21 + ((uVar5 >> 7 | (uint)data[0xb] << 0x19) ^ (uVar4 >> 0x12 | uVar5 << 0xe) ^
                     uVar5 >> 3) + uVar3;
    iVar34 = uVar38 + ((uVar35 >> 6 | uVar35 * 0x4000000) ^ (uVar35 >> 0xb | uVar35 * 0x200000) ^
                      (uVar35 >> 0x19 | uVar35 * 0x80)) +
             (uVar35 & uVar42 ^ (uVar35 ^ 0xffffffff) & uVar40) + sha2_256_words[0x11] + uVar3;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar5 = ((uVar1 >> 0x11 | uVar1 * 0x8000) ^ (uVar1 >> 0x13 | uVar1 * 0x2000) ^ uVar1 >> 10) +
            uVar23 + ((uVar7 >> 7 | (uint)data[0xf] << 0x19) ^ (uVar6 >> 0x12 | uVar7 << 0xe) ^
                     uVar7 >> 3) + uVar5;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar35 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x12] + uVar5;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                      (uVar4 >> 0x16 | uVar4 * 0x400)) +
                      (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar7 = ((uVar3 >> 0x11 | uVar3 * 0x8000) ^ (uVar3 >> 0x13 | uVar3 * 0x2000) ^ uVar3 >> 10) +
            uVar25 + ((uVar9 >> 7 | (uint)data[0x13] << 0x19) ^ (uVar8 >> 0x12 | uVar9 << 0xe) ^
                     uVar9 >> 3) + uVar7;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar35) + sha2_256_words[0x13] + uVar7;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar4 ^ uVar40 & uVar2 ^ uVar4 & uVar2);
    uVar9 = ((uVar5 >> 0x11 | uVar5 * 0x8000) ^ (uVar5 >> 0x13 | uVar5 * 0x2000) ^ uVar5 >> 10) +
            uVar27 + ((uVar11 >> 7 | (uint)data[0x17] << 0x19) ^ (uVar10 >> 0x12 | uVar11 << 0xe) ^
                     uVar11 >> 3) + uVar9;
    iVar34 = uVar35 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                      (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x14] + uVar9;
    uVar2 = uVar2 + iVar34;
    uVar6 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                     (uVar42 >> 0x16 | uVar42 * 0x400)) +
                     (uVar42 & uVar40 ^ uVar42 & uVar4 ^ uVar40 & uVar4);
    uVar11 = ((uVar7 >> 0x11 | uVar7 * 0x8000) ^ (uVar7 >> 0x13 | uVar7 * 0x2000) ^ uVar7 >> 10) +
             uVar30 + ((uVar13 >> 7 | (uint)data[0x1b] << 0x19) ^ (uVar12 >> 0x12 | uVar13 << 0xe) ^
                      uVar13 >> 3) + uVar11;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x15] + uVar11;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                      (uVar6 >> 0x16 | uVar6 * 0x400)) +
                      (uVar6 & uVar42 ^ uVar6 & uVar40 ^ uVar42 & uVar40);
    uVar13 = ((uVar9 >> 0x11 | uVar9 * 0x8000) ^ (uVar9 >> 0x13 | uVar9 * 0x2000) ^ uVar9 >> 10) +
             uVar33 + ((uVar15 >> 7 | (uint)data[0x1f] << 0x19) ^ (uVar14 >> 0x12 | uVar15 << 0xe) ^
                      uVar15 >> 3) + uVar13;
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x16] + uVar13;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar6 ^ uVar37 & uVar42 ^ uVar6 & uVar42);
    uVar15 = ((uVar11 >> 0x11 | uVar11 * 0x8000) ^ (uVar11 >> 0x13 | uVar11 * 0x2000) ^ uVar11 >> 10
             ) + uVar1 +
             ((uVar17 >> 7 | (uint)data[0x23] << 0x19) ^ (uVar16 >> 0x12 | uVar17 << 0xe) ^
             uVar17 >> 3) + uVar15;
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar4 ^ (uVar40 ^ 0xffffffff) & uVar2) + sha2_256_words[0x17] + uVar15;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar6 ^ uVar37 & uVar6);
    uVar17 = ((uVar13 >> 0x11 | uVar13 * 0x8000) ^ (uVar13 >> 0x13 | uVar13 * 0x2000) ^ uVar13 >> 10
             ) + uVar3 +
             ((uVar19 >> 7 | (uint)data[0x27] << 0x19) ^ (uVar18 >> 0x12 | uVar19 << 0xe) ^
             uVar19 >> 3) + uVar17;
    iVar34 = uVar2 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                     (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar4) + sha2_256_words[0x18] + uVar17;
    uVar6 = uVar6 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar19 = ((uVar15 >> 0x11 | uVar15 * 0x8000) ^ (uVar15 >> 0x13 | uVar15 * 0x2000) ^ uVar15 >> 10
             ) + uVar5 +
             ((uVar21 >> 7 | (uint)data[0x2b] << 0x19) ^ (uVar20 >> 0x12 | uVar21 << 0xe) ^
             uVar21 >> 3) + uVar19;
    iVar34 = uVar4 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                     (uVar6 >> 0x19 | uVar6 * 0x80)) +
             (uVar6 & uVar42 ^ (uVar6 ^ 0xffffffff) & uVar40) + sha2_256_words[0x19] + uVar19;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar21 = ((uVar17 >> 0x11 | uVar17 * 0x8000) ^ (uVar17 >> 0x13 | uVar17 * 0x2000) ^ uVar17 >> 10
             ) + uVar7 +
             ((uVar23 >> 7 | (uint)data[0x2f] << 0x19) ^ (uVar22 >> 0x12 | uVar23 << 0xe) ^
             uVar23 >> 3) + uVar21;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar6 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x1a] + uVar21;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                      (uVar4 >> 0x16 | uVar4 * 0x400)) +
                      (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar23 = ((uVar19 >> 0x11 | uVar19 * 0x8000) ^ (uVar19 >> 0x13 | uVar19 * 0x2000) ^ uVar19 >> 10
             ) + uVar9 +
             ((uVar25 >> 7 | (uint)data[0x33] << 0x19) ^ (uVar24 >> 0x12 | uVar25 << 0xe) ^
             uVar25 >> 3) + uVar23;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar6) + sha2_256_words[0x1b] + uVar23;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar4 ^ uVar40 & uVar2 ^ uVar4 & uVar2);
    uVar25 = ((uVar21 >> 0x11 | uVar21 * 0x8000) ^ (uVar21 >> 0x13 | uVar21 * 0x2000) ^ uVar21 >> 10
             ) + uVar11 +
             ((uVar27 >> 7 | (uint)data[0x37] << 0x19) ^ (uVar26 >> 0x12 | uVar27 << 0xe) ^
             uVar27 >> 3) + uVar25;
    iVar34 = uVar6 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                     (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x1c] + uVar25;
    uVar2 = uVar2 + iVar34;
    uVar6 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                     (uVar42 >> 0x16 | uVar42 * 0x400)) +
                     (uVar42 & uVar40 ^ uVar42 & uVar4 ^ uVar40 & uVar4);
    uVar27 = ((uVar23 >> 0x11 | uVar23 * 0x8000) ^ (uVar23 >> 0x13 | uVar23 * 0x2000) ^ uVar23 >> 10
             ) + uVar13 +
             ((uVar30 >> 7 | (uint)data[0x3b] << 0x19) ^ (uVar28 >> 0x12 | uVar30 << 0xe) ^
             uVar30 >> 3) + uVar27;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x1d] + uVar27;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                      (uVar6 >> 0x16 | uVar6 * 0x400)) +
                      (uVar6 & uVar42 ^ uVar6 & uVar40 ^ uVar42 & uVar40);
    uVar30 = ((uVar25 >> 0x11 | uVar25 * 0x8000) ^ (uVar25 >> 0x13 | uVar25 * 0x2000) ^ uVar25 >> 10
             ) + uVar15 +
             ((uVar33 >> 7 | (uint)data[0x3f] << 0x19) ^ (uVar31 >> 0x12 | uVar33 << 0xe) ^
             uVar33 >> 3) + uVar30;
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x1e] + uVar30;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar6 ^ uVar37 & uVar42 ^ uVar6 & uVar42);
    uVar33 = ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10
             ) + uVar17 +
             ((uVar1 >> 7 | uVar1 * 0x2000000) ^ (uVar1 >> 0x12 | uVar1 * 0x4000) ^ uVar1 >> 3) +
             uVar33;
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar4 ^ (uVar40 ^ 0xffffffff) & uVar2) + sha2_256_words[0x1f] + uVar33;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar6 ^ uVar37 & uVar6);
    uVar1 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
            + uVar19 +
            ((uVar3 >> 7 | uVar3 * 0x2000000) ^ (uVar3 >> 0x12 | uVar3 * 0x4000) ^ uVar3 >> 3) +
            uVar1;
    iVar34 = uVar2 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                     (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar4) + sha2_256_words[0x20] + uVar1;
    uVar6 = uVar6 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar3 = ((uVar33 >> 0x11 | uVar33 * 0x8000) ^ (uVar33 >> 0x13 | uVar33 * 0x2000) ^ uVar33 >> 10)
            + uVar21 +
            ((uVar5 >> 7 | uVar5 * 0x2000000) ^ (uVar5 >> 0x12 | uVar5 * 0x4000) ^ uVar5 >> 3) +
            uVar3;
    iVar34 = uVar4 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                     (uVar6 >> 0x19 | uVar6 * 0x80)) +
             (uVar6 & uVar42 ^ (uVar6 ^ 0xffffffff) & uVar40) + sha2_256_words[0x21] + uVar3;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar5 = ((uVar1 >> 0x11 | uVar1 * 0x8000) ^ (uVar1 >> 0x13 | uVar1 * 0x2000) ^ uVar1 >> 10) +
            uVar23 + ((uVar7 >> 7 | uVar7 * 0x2000000) ^ (uVar7 >> 0x12 | uVar7 * 0x4000) ^
                     uVar7 >> 3) + uVar5;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar6 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x22] + uVar5;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                      (uVar4 >> 0x16 | uVar4 * 0x400)) +
                      (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar7 = ((uVar3 >> 0x11 | uVar3 * 0x8000) ^ (uVar3 >> 0x13 | uVar3 * 0x2000) ^ uVar3 >> 10) +
            uVar25 + ((uVar9 >> 7 | uVar9 * 0x2000000) ^ (uVar9 >> 0x12 | uVar9 * 0x4000) ^
                     uVar9 >> 3) + uVar7;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar6) + sha2_256_words[0x23] + uVar7;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar4 ^ uVar40 & uVar2 ^ uVar4 & uVar2);
    uVar9 = ((uVar5 >> 0x11 | uVar5 * 0x8000) ^ (uVar5 >> 0x13 | uVar5 * 0x2000) ^ uVar5 >> 10) +
            uVar27 + ((uVar11 >> 7 | uVar11 * 0x2000000) ^ (uVar11 >> 0x12 | uVar11 * 0x4000) ^
                     uVar11 >> 3) + uVar9;
    iVar34 = uVar6 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                     (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x24] + uVar9;
    uVar2 = uVar2 + iVar34;
    uVar6 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                     (uVar42 >> 0x16 | uVar42 * 0x400)) +
                     (uVar42 & uVar40 ^ uVar42 & uVar4 ^ uVar40 & uVar4);
    uVar11 = ((uVar7 >> 0x11 | uVar7 * 0x8000) ^ (uVar7 >> 0x13 | uVar7 * 0x2000) ^ uVar7 >> 10) +
             uVar30 + ((uVar13 >> 7 | uVar13 * 0x2000000) ^ (uVar13 >> 0x12 | uVar13 * 0x4000) ^
                      uVar13 >> 3) + uVar11;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x25] + uVar11;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                      (uVar6 >> 0x16 | uVar6 * 0x400)) +
                      (uVar6 & uVar42 ^ uVar6 & uVar40 ^ uVar42 & uVar40);
    uVar13 = ((uVar9 >> 0x11 | uVar9 * 0x8000) ^ (uVar9 >> 0x13 | uVar9 * 0x2000) ^ uVar9 >> 10) +
             uVar33 + ((uVar15 >> 7 | uVar15 * 0x2000000) ^ (uVar15 >> 0x12 | uVar15 * 0x4000) ^
                      uVar15 >> 3) + uVar13;
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x26] + uVar13;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar6 ^ uVar37 & uVar42 ^ uVar6 & uVar42);
    uVar15 = ((uVar11 >> 0x11 | uVar11 * 0x8000) ^ (uVar11 >> 0x13 | uVar11 * 0x2000) ^ uVar11 >> 10
             ) + uVar1 +
             ((uVar17 >> 7 | uVar17 * 0x2000000) ^ (uVar17 >> 0x12 | uVar17 * 0x4000) ^ uVar17 >> 3)
             + uVar15;
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar4 ^ (uVar40 ^ 0xffffffff) & uVar2) + sha2_256_words[0x27] + uVar15;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar6 ^ uVar37 & uVar6);
    uVar17 = ((uVar13 >> 0x11 | uVar13 * 0x8000) ^ (uVar13 >> 0x13 | uVar13 * 0x2000) ^ uVar13 >> 10
             ) + uVar3 +
             ((uVar19 >> 7 | uVar19 * 0x2000000) ^ (uVar19 >> 0x12 | uVar19 * 0x4000) ^ uVar19 >> 3)
             + uVar17;
    iVar34 = uVar2 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                     (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar4) + sha2_256_words[0x28] + uVar17;
    uVar6 = uVar6 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar19 = ((uVar15 >> 0x11 | uVar15 * 0x8000) ^ (uVar15 >> 0x13 | uVar15 * 0x2000) ^ uVar15 >> 10
             ) + uVar5 +
             ((uVar21 >> 7 | uVar21 * 0x2000000) ^ (uVar21 >> 0x12 | uVar21 * 0x4000) ^ uVar21 >> 3)
             + uVar19;
    iVar34 = uVar4 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                     (uVar6 >> 0x19 | uVar6 * 0x80)) +
             (uVar6 & uVar42 ^ (uVar6 ^ 0xffffffff) & uVar40) + sha2_256_words[0x29] + uVar19;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar21 = ((uVar17 >> 0x11 | uVar17 * 0x8000) ^ (uVar17 >> 0x13 | uVar17 * 0x2000) ^ uVar17 >> 10
             ) + uVar7 +
             ((uVar23 >> 7 | uVar23 * 0x2000000) ^ (uVar23 >> 0x12 | uVar23 * 0x4000) ^ uVar23 >> 3)
             + uVar21;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar6 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x2a] + uVar21;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                      (uVar4 >> 0x16 | uVar4 * 0x400)) +
                      (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar23 = ((uVar19 >> 0x11 | uVar19 * 0x8000) ^ (uVar19 >> 0x13 | uVar19 * 0x2000) ^ uVar19 >> 10
             ) + uVar9 +
             ((uVar25 >> 7 | uVar25 * 0x2000000) ^ (uVar25 >> 0x12 | uVar25 * 0x4000) ^ uVar25 >> 3)
             + uVar23;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar6) + sha2_256_words[0x2b] + uVar23;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar4 ^ uVar40 & uVar2 ^ uVar4 & uVar2);
    uVar25 = ((uVar21 >> 0x11 | uVar21 * 0x8000) ^ (uVar21 >> 0x13 | uVar21 * 0x2000) ^ uVar21 >> 10
             ) + uVar11 +
             ((uVar27 >> 7 | uVar27 * 0x2000000) ^ (uVar27 >> 0x12 | uVar27 * 0x4000) ^ uVar27 >> 3)
             + uVar25;
    iVar34 = uVar6 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                     (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x2c] + uVar25;
    uVar2 = uVar2 + iVar34;
    uVar6 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                     (uVar42 >> 0x16 | uVar42 * 0x400)) +
                     (uVar42 & uVar40 ^ uVar42 & uVar4 ^ uVar40 & uVar4);
    uVar27 = ((uVar23 >> 0x11 | uVar23 * 0x8000) ^ (uVar23 >> 0x13 | uVar23 * 0x2000) ^ uVar23 >> 10
             ) + uVar13 +
             ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3)
             + uVar27;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x2d] + uVar27;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                      (uVar6 >> 0x16 | uVar6 * 0x400)) +
                      (uVar6 & uVar42 ^ uVar6 & uVar40 ^ uVar42 & uVar40);
    uVar30 = ((uVar25 >> 0x11 | uVar25 * 0x8000) ^ (uVar25 >> 0x13 | uVar25 * 0x2000) ^ uVar25 >> 10
             ) + uVar15 +
             ((uVar33 >> 7 | uVar33 * 0x2000000) ^ (uVar33 >> 0x12 | uVar33 * 0x4000) ^ uVar33 >> 3)
             + uVar30;
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x2e] + uVar30;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar6 ^ uVar37 & uVar42 ^ uVar6 & uVar42);
    uVar33 = ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10
             ) + uVar17 +
             ((uVar1 >> 7 | uVar1 * 0x2000000) ^ (uVar1 >> 0x12 | uVar1 * 0x4000) ^ uVar1 >> 3) +
             uVar33;
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar4 ^ (uVar40 ^ 0xffffffff) & uVar2) + sha2_256_words[0x2f] + uVar33;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar6 ^ uVar37 & uVar6);
    uVar1 = ((uVar30 >> 0x11 | uVar30 * 0x8000) ^ (uVar30 >> 0x13 | uVar30 * 0x2000) ^ uVar30 >> 10)
            + uVar19 +
            ((uVar3 >> 7 | uVar3 * 0x2000000) ^ (uVar3 >> 0x12 | uVar3 * 0x4000) ^ uVar3 >> 3) +
            uVar1;
    iVar34 = uVar2 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                     (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar4) + sha2_256_words[0x30] + uVar1;
    uVar6 = uVar6 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar3 = ((uVar33 >> 0x11 | uVar33 * 0x8000) ^ (uVar33 >> 0x13 | uVar33 * 0x2000) ^ uVar33 >> 10)
            + uVar21 +
            ((uVar5 >> 7 | uVar5 * 0x2000000) ^ (uVar5 >> 0x12 | uVar5 * 0x4000) ^ uVar5 >> 3) +
            uVar3;
    iVar34 = uVar4 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                     (uVar6 >> 0x19 | uVar6 * 0x80)) +
             (uVar6 & uVar42 ^ (uVar6 ^ 0xffffffff) & uVar40) + sha2_256_words[0x31] + uVar3;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar5 = ((uVar1 >> 0x11 | uVar1 * 0x8000) ^ (uVar1 >> 0x13 | uVar1 * 0x2000) ^ uVar1 >> 10) +
            uVar23 + ((uVar7 >> 7 | uVar7 * 0x2000000) ^ (uVar7 >> 0x12 | uVar7 * 0x4000) ^
                     uVar7 >> 3) + uVar5;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar6 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x32] + uVar5;
    uVar39 = uVar39 + iVar34;
    uVar40 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                      (uVar4 >> 0x16 | uVar4 * 0x400)) +
                      (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar7 = ((uVar3 >> 0x11 | uVar3 * 0x8000) ^ (uVar3 >> 0x13 | uVar3 * 0x2000) ^ uVar3 >> 10) +
            uVar25 + ((uVar9 >> 7 | uVar9 * 0x2000000) ^ (uVar9 >> 0x12 | uVar9 * 0x4000) ^
                     uVar9 >> 3) + uVar7;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar6) + sha2_256_words[0x33] + uVar7;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar4 ^ uVar40 & uVar2 ^ uVar4 & uVar2);
    uVar9 = ((uVar5 >> 0x11 | uVar5 * 0x8000) ^ (uVar5 >> 0x13 | uVar5 * 0x2000) ^ uVar5 >> 10) +
            uVar27 + ((uVar11 >> 7 | uVar11 * 0x2000000) ^ (uVar11 >> 0x12 | uVar11 * 0x4000) ^
                     uVar11 >> 3) + uVar9;
    iVar34 = uVar6 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                     (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x34] + uVar9;
    uVar2 = uVar2 + iVar34;
    uVar6 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                     (uVar42 >> 0x16 | uVar42 * 0x400)) +
                     (uVar42 & uVar40 ^ uVar42 & uVar4 ^ uVar40 & uVar4);
    uVar11 = ((uVar7 >> 0x11 | uVar7 * 0x8000) ^ (uVar7 >> 0x13 | uVar7 * 0x2000) ^ uVar7 >> 10) +
             uVar30 + ((uVar13 >> 7 | uVar13 * 0x2000000) ^ (uVar13 >> 0x12 | uVar13 * 0x4000) ^
                      uVar13 >> 3) + uVar11;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x35] + uVar11;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar6 >> 2 | uVar6 * 0x40000000) ^ (uVar6 >> 0xd | uVar6 * 0x80000) ^
                      (uVar6 >> 0x16 | uVar6 * 0x400)) +
                      (uVar6 & uVar42 ^ uVar6 & uVar40 ^ uVar42 & uVar40);
    uVar13 = ((uVar9 >> 0x11 | uVar9 * 0x8000) ^ (uVar9 >> 0x13 | uVar9 * 0x2000) ^ uVar9 >> 10) +
             uVar33 + ((uVar15 >> 7 | uVar15 * 0x2000000) ^ (uVar15 >> 0x12 | uVar15 * 0x4000) ^
                      uVar15 >> 3) + uVar13;
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x36] + uVar13;
    uVar40 = uVar40 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar6 ^ uVar37 & uVar42 ^ uVar6 & uVar42);
    uVar15 = ((uVar11 >> 0x11 | uVar11 * 0x8000) ^ (uVar11 >> 0x13 | uVar11 * 0x2000) ^ uVar11 >> 10
             ) + uVar1 +
             ((uVar17 >> 7 | uVar17 * 0x2000000) ^ (uVar17 >> 0x12 | uVar17 * 0x4000) ^ uVar17 >> 3)
             + uVar15;
    iVar34 = uVar41 + ((uVar40 >> 6 | uVar40 * 0x4000000) ^ (uVar40 >> 0xb | uVar40 * 0x200000) ^
                      (uVar40 >> 0x19 | uVar40 * 0x80)) +
             (uVar40 & uVar4 ^ (uVar40 ^ 0xffffffff) & uVar2) + sha2_256_words[0x37] + uVar15;
    uVar42 = uVar42 + iVar34;
    uVar41 = iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                      (uVar39 >> 0x16 | uVar39 * 0x400)) +
                      (uVar39 & uVar37 ^ uVar39 & uVar6 ^ uVar37 & uVar6);
    uVar17 = ((uVar13 >> 0x11 | uVar13 * 0x8000) ^ (uVar13 >> 0x13 | uVar13 * 0x2000) ^ uVar13 >> 10
             ) + uVar3 +
             ((uVar19 >> 7 | uVar19 * 0x2000000) ^ (uVar19 >> 0x12 | uVar19 * 0x4000) ^ uVar19 >> 3)
             + uVar17;
    iVar34 = uVar2 + ((uVar42 >> 6 | uVar42 * 0x4000000) ^ (uVar42 >> 0xb | uVar42 * 0x200000) ^
                     (uVar42 >> 0x19 | uVar42 * 0x80)) +
             (uVar42 & uVar40 ^ (uVar42 ^ 0xffffffff) & uVar4) + sha2_256_words[0x38] + uVar17;
    uVar6 = uVar6 + iVar34;
    uVar2 = iVar34 + ((uVar41 >> 2 | uVar41 * 0x40000000) ^ (uVar41 >> 0xd | uVar41 * 0x80000) ^
                     (uVar41 >> 0x16 | uVar41 * 0x400)) +
                     (uVar41 & uVar39 ^ uVar41 & uVar37 ^ uVar39 & uVar37);
    uVar19 = ((uVar15 >> 0x11 | uVar15 * 0x8000) ^ (uVar15 >> 0x13 | uVar15 * 0x2000) ^ uVar15 >> 10
             ) + uVar5 +
             ((uVar21 >> 7 | uVar21 * 0x2000000) ^ (uVar21 >> 0x12 | uVar21 * 0x4000) ^ uVar21 >> 3)
             + uVar19;
    iVar34 = uVar4 + ((uVar6 >> 6 | uVar6 * 0x4000000) ^ (uVar6 >> 0xb | uVar6 * 0x200000) ^
                     (uVar6 >> 0x19 | uVar6 * 0x80)) +
             (uVar6 & uVar42 ^ (uVar6 ^ 0xffffffff) & uVar40) + sha2_256_words[0x39] + uVar19;
    uVar37 = uVar37 + iVar34;
    uVar4 = iVar34 + ((uVar2 >> 2 | uVar2 * 0x40000000) ^ (uVar2 >> 0xd | uVar2 * 0x80000) ^
                     (uVar2 >> 0x16 | uVar2 * 0x400)) +
                     (uVar2 & uVar41 ^ uVar2 & uVar39 ^ uVar41 & uVar39);
    uVar21 = ((uVar17 >> 0x11 | uVar17 * 0x8000) ^ (uVar17 >> 0x13 | uVar17 * 0x2000) ^ uVar17 >> 10
             ) + uVar7 +
             ((uVar23 >> 7 | uVar23 * 0x2000000) ^ (uVar23 >> 0x12 | uVar23 * 0x4000) ^ uVar23 >> 3)
             + uVar21;
    iVar34 = uVar40 + ((uVar37 >> 6 | uVar37 * 0x4000000) ^ (uVar37 >> 0xb | uVar37 * 0x200000) ^
                      (uVar37 >> 0x19 | uVar37 * 0x80)) +
             (uVar37 & uVar6 ^ (uVar37 ^ 0xffffffff) & uVar42) + sha2_256_words[0x3a] + uVar21;
    uVar39 = uVar39 + iVar34;
    uVar8 = iVar34 + ((uVar4 >> 2 | uVar4 * 0x40000000) ^ (uVar4 >> 0xd | uVar4 * 0x80000) ^
                     (uVar4 >> 0x16 | uVar4 * 0x400)) +
                     (uVar4 & uVar2 ^ uVar4 & uVar41 ^ uVar2 & uVar41);
    uVar23 = ((uVar19 >> 0x11 | uVar19 * 0x8000) ^ (uVar19 >> 0x13 | uVar19 * 0x2000) ^ uVar19 >> 10
             ) + uVar9 +
             ((uVar25 >> 7 | uVar25 * 0x2000000) ^ (uVar25 >> 0x12 | uVar25 * 0x4000) ^ uVar25 >> 3)
             + uVar23;
    iVar34 = uVar42 + ((uVar39 >> 6 | uVar39 * 0x4000000) ^ (uVar39 >> 0xb | uVar39 * 0x200000) ^
                      (uVar39 >> 0x19 | uVar39 * 0x80)) +
             (uVar39 & uVar37 ^ (uVar39 ^ 0xffffffff) & uVar6) + sha2_256_words[0x3b] + uVar23;
    uVar41 = uVar41 + iVar34;
    uVar42 = iVar34 + ((uVar8 >> 2 | uVar8 * 0x40000000) ^ (uVar8 >> 0xd | uVar8 * 0x80000) ^
                      (uVar8 >> 0x16 | uVar8 * 0x400)) +
                      (uVar8 & uVar4 ^ uVar8 & uVar2 ^ uVar4 & uVar2);
    uVar25 = ((uVar21 >> 0x11 | uVar21 * 0x8000) ^ (uVar21 >> 0x13 | uVar21 * 0x2000) ^ uVar21 >> 10
             ) + uVar11 +
             ((uVar27 >> 7 | uVar27 * 0x2000000) ^ (uVar27 >> 0x12 | uVar27 * 0x4000) ^ uVar27 >> 3)
             + uVar25;
    iVar34 = uVar6 + ((uVar41 >> 6 | uVar41 * 0x4000000) ^ (uVar41 >> 0xb | uVar41 * 0x200000) ^
                     (uVar41 >> 0x19 | uVar41 * 0x80)) +
             (uVar41 & uVar39 ^ (uVar41 ^ 0xffffffff) & uVar37) + sha2_256_words[0x3c] + uVar25;
    uVar2 = uVar2 + iVar34;
    uVar40 = iVar34 + ((uVar42 >> 2 | uVar42 * 0x40000000) ^ (uVar42 >> 0xd | uVar42 * 0x80000) ^
                      (uVar42 >> 0x16 | uVar42 * 0x400)) +
                      (uVar42 & uVar8 ^ uVar42 & uVar4 ^ uVar8 & uVar4);
    uVar27 = ((uVar23 >> 0x11 | uVar23 * 0x8000) ^ (uVar23 >> 0x13 | uVar23 * 0x2000) ^ uVar23 >> 10
             ) + uVar13 +
             ((uVar30 >> 7 | uVar30 * 0x2000000) ^ (uVar30 >> 0x12 | uVar30 * 0x4000) ^ uVar30 >> 3)
             + uVar27;
    iVar34 = uVar37 + ((uVar2 >> 6 | uVar2 * 0x4000000) ^ (uVar2 >> 0xb | uVar2 * 0x200000) ^
                      (uVar2 >> 0x19 | uVar2 * 0x80)) +
             (uVar2 & uVar41 ^ (uVar2 ^ 0xffffffff) & uVar39) + sha2_256_words[0x3d] + uVar27;
    uVar4 = uVar4 + iVar34;
    uVar37 = iVar34 + ((uVar40 >> 2 | uVar40 * 0x40000000) ^ (uVar40 >> 0xd | uVar40 * 0x80000) ^
                      (uVar40 >> 0x16 | uVar40 * 0x400)) +
                      (uVar40 & uVar42 ^ uVar40 & uVar8 ^ uVar42 & uVar8);
    iVar34 = uVar39 + ((uVar4 >> 6 | uVar4 * 0x4000000) ^ (uVar4 >> 0xb | uVar4 * 0x200000) ^
                      (uVar4 >> 0x19 | uVar4 * 0x80)) +
             (uVar4 & uVar2 ^ (uVar4 ^ 0xffffffff) & uVar41) + sha2_256_words[0x3e] +
             ((uVar25 >> 0x11 | uVar25 * 0x8000) ^ (uVar25 >> 0x13 | uVar25 * 0x2000) ^ uVar25 >> 10
             ) + uVar15 +
             ((uVar33 >> 7 | uVar33 * 0x2000000) ^ (uVar33 >> 0x12 | uVar33 * 0x4000) ^ uVar33 >> 3)
             + uVar30;
    uVar8 = uVar8 + iVar34;
    uVar39 = iVar34 + ((uVar37 >> 2 | uVar37 * 0x40000000) ^ (uVar37 >> 0xd | uVar37 * 0x80000) ^
                      (uVar37 >> 0x16 | uVar37 * 0x400)) +
                      (uVar37 & uVar40 ^ uVar37 & uVar42 ^ uVar40 & uVar42);
    iVar34 = uVar41 + ((uVar8 >> 6 | uVar8 * 0x4000000) ^ (uVar8 >> 0xb | uVar8 * 0x200000) ^
                      (uVar8 >> 0x19 | uVar8 * 0x80)) +
             (uVar8 & uVar4 ^ (uVar8 ^ 0xffffffff) & uVar2) + sha2_256_words[0x3f] +
             ((uVar27 >> 0x11 | uVar27 * 0x8000) ^ (uVar27 >> 0x13 | uVar27 * 0x2000) ^ uVar27 >> 10
             ) + uVar17 +
             ((uVar1 >> 7 | uVar1 * 0x2000000) ^ (uVar1 >> 0x12 | uVar1 * 0x4000) ^ uVar1 >> 3) +
             uVar33;
    (s->digest).i32[0] =
         iVar34 + ((uVar39 >> 2 | uVar39 * 0x40000000) ^ (uVar39 >> 0xd | uVar39 * 0x80000) ^
                  (uVar39 >> 0x16 | uVar39 * 0x400)) +
                  (uVar39 & uVar37 ^ uVar39 & uVar40 ^ uVar37 & uVar40) + (s->digest).i32[0];
    (s->digest).i32[1] = uVar39 + (s->digest).i32[1];
    (s->digest).i32[2] = uVar37 + (s->digest).i32[2];
    (s->digest).i32[3] = uVar40 + (s->digest).i32[3];
    (s->digest).i32[4] = uVar42 + iVar34 + (s->digest).i32[4];
    (s->digest).i32[5] = uVar8 + (s->digest).i32[5];
    (s->digest).i32[6] = uVar4 + (s->digest).i32[6];
    (s->digest).i32[7] = uVar2 + (s->digest).i32[7];
  }
  else {
    uVar83 = (s->digest).i64[0];
    uVar81 = (s->digest).i64[1];
    uVar79 = (s->digest).i64[2];
    uVar84 = (s->digest).i64[4];
    uVar82 = (s->digest).i64[5];
    uVar43 = (ulong)*data << 0x38 | (ulong)data[1] << 0x30 | (ulong)data[2] << 0x28 |
             (ulong)data[3] << 0x20 | (ulong)data[4] << 0x18 | (ulong)data[5] << 0x10 |
             (ulong)data[6] << 8 | (ulong)data[7];
    uVar44 = (ulong)data[8] << 0x38 | (ulong)data[9] << 0x30 | (ulong)data[10] << 0x28 |
             (ulong)data[0xb] << 0x20 | (ulong)data[0xc] << 0x18 | (ulong)data[0xd] << 0x10 |
             (ulong)data[0xe] << 8;
    uVar85 = (ulong)data[0xf];
    uVar45 = uVar44 | uVar85;
    uVar46 = (ulong)data[0x10] << 0x38 | (ulong)data[0x11] << 0x30 | (ulong)data[0x12] << 0x28 |
             (ulong)data[0x13] << 0x20 | (ulong)data[0x14] << 0x18 | (ulong)data[0x15] << 0x10 |
             (ulong)data[0x16] << 8;
    uVar86 = (ulong)data[0x17];
    uVar47 = uVar46 | uVar86;
    uVar48 = (ulong)data[0x18] << 0x38 | (ulong)data[0x19] << 0x30 | (ulong)data[0x1a] << 0x28 |
             (ulong)data[0x1b] << 0x20 | (ulong)data[0x1c] << 0x18 | (ulong)data[0x1d] << 0x10 |
             (ulong)data[0x1e] << 8;
    uVar87 = (ulong)data[0x1f];
    uVar49 = uVar48 | uVar87;
    uVar50 = (ulong)data[0x20] << 0x38 | (ulong)data[0x21] << 0x30 | (ulong)data[0x22] << 0x28 |
             (ulong)data[0x23] << 0x20 | (ulong)data[0x24] << 0x18 | (ulong)data[0x25] << 0x10 |
             (ulong)data[0x26] << 8;
    uVar88 = (ulong)data[0x27];
    uVar51 = uVar50 | uVar88;
    uVar52 = (ulong)data[0x28] << 0x38 | (ulong)data[0x29] << 0x30 | (ulong)data[0x2a] << 0x28 |
             (ulong)data[0x2b] << 0x20 | (ulong)data[0x2c] << 0x18 | (ulong)data[0x2d] << 0x10 |
             (ulong)data[0x2e] << 8;
    uVar89 = (ulong)data[0x2f];
    uVar53 = uVar52 | uVar89;
    uVar54 = (ulong)data[0x30] << 0x38 | (ulong)data[0x31] << 0x30 | (ulong)data[0x32] << 0x28 |
             (ulong)data[0x33] << 0x20 | (ulong)data[0x34] << 0x18 | (ulong)data[0x35] << 0x10 |
             (ulong)data[0x36] << 8;
    uVar90 = (ulong)data[0x37];
    uVar55 = uVar54 | uVar90;
    uVar56 = (ulong)data[0x38] << 0x38 | (ulong)data[0x39] << 0x30 | (ulong)data[0x3a] << 0x28 |
             (ulong)data[0x3b] << 0x20 | (ulong)data[0x3c] << 0x18 | (ulong)data[0x3d] << 0x10 |
             (ulong)data[0x3e] << 8;
    uVar91 = (ulong)data[0x3f];
    uVar57 = uVar56 | uVar91;
    uVar58 = (ulong)data[0x40] << 0x38 | (ulong)data[0x41] << 0x30 | (ulong)data[0x42] << 0x28 |
             (ulong)data[0x43] << 0x20 | (ulong)data[0x44] << 0x18 | (ulong)data[0x45] << 0x10 |
             (ulong)data[0x46] << 8;
    uVar92 = (ulong)data[0x47];
    uVar59 = uVar58 | uVar92;
    uVar60 = (ulong)data[0x48] << 0x38 | (ulong)data[0x49] << 0x30 | (ulong)data[0x4a] << 0x28 |
             (ulong)data[0x4b] << 0x20 | (ulong)data[0x4c] << 0x18 | (ulong)data[0x4d] << 0x10 |
             (ulong)data[0x4e] << 8;
    uVar93 = (ulong)data[0x4f];
    uVar61 = uVar60 | uVar93;
    uVar62 = (ulong)data[0x50] << 0x38 | (ulong)data[0x51] << 0x30 | (ulong)data[0x52] << 0x28 |
             (ulong)data[0x53] << 0x20 | (ulong)data[0x54] << 0x18 | (ulong)data[0x55] << 0x10 |
             (ulong)data[0x56] << 8;
    uVar94 = (ulong)data[0x57];
    uVar63 = uVar62 | uVar94;
    uVar64 = (ulong)data[0x58] << 0x38 | (ulong)data[0x59] << 0x30 | (ulong)data[0x5a] << 0x28 |
             (ulong)data[0x5b] << 0x20 | (ulong)data[0x5c] << 0x18 | (ulong)data[0x5d] << 0x10 |
             (ulong)data[0x5e] << 8;
    uVar95 = (ulong)data[0x5f];
    uVar65 = uVar64 | uVar95;
    uVar66 = (ulong)data[0x60] << 0x38 | (ulong)data[0x61] << 0x30 | (ulong)data[0x62] << 0x28 |
             (ulong)data[99] << 0x20 | (ulong)data[100] << 0x18 | (ulong)data[0x65] << 0x10 |
             (ulong)data[0x66] << 8;
    uVar96 = (ulong)data[0x67];
    uVar67 = uVar66 | uVar96;
    uVar68 = (ulong)data[0x68] << 0x38 | (ulong)data[0x69] << 0x30 | (ulong)data[0x6a] << 0x28 |
             (ulong)data[0x6b] << 0x20 | (ulong)data[0x6c] << 0x18 | (ulong)data[0x6d] << 0x10 |
             (ulong)data[0x6e] << 8;
    uVar97 = (ulong)data[0x6f];
    uVar69 = uVar68 | uVar97;
    uVar70 = (ulong)data[0x70] << 0x38 | (ulong)data[0x71] << 0x30 | (ulong)data[0x72] << 0x28 |
             (ulong)data[0x73] << 0x20 | (ulong)data[0x74] << 0x18 | (ulong)data[0x75] << 0x10;
    uVar71 = uVar70 | (ulong)data[0x76] << 8;
    uVar98 = (ulong)data[0x77];
    uVar72 = uVar71 | uVar98;
    uVar73 = (ulong)data[0x78] << 0x38 | (ulong)data[0x79] << 0x30 | (ulong)data[0x7a] << 0x28 |
             (ulong)data[0x7b] << 0x20 | (ulong)data[0x7c] << 0x18 | (ulong)data[0x7d] << 0x10;
    uVar74 = uVar73 | (ulong)data[0x7e] << 8;
    uVar99 = (ulong)data[0x7f];
    uVar75 = uVar74 | uVar99;
    lVar76 = (s->digest).i64[7] +
             ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
             (uVar84 >> 0x29 | uVar84 << 0x17)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & (s->digest).i64[6]) +
             sha2_512_words[0] + uVar43;
    uVar77 = (s->digest).i64[3] + lVar76;
    uVar78 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 << 0x1e) ^
                      (uVar83 >> 0x27 | uVar83 << 0x19)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    lVar76 = (s->digest).i64[6] +
             ((uVar77 >> 0xe | uVar77 << 0x32) ^ (uVar77 >> 0x12 | uVar77 << 0x2e) ^
             (uVar77 >> 0x29 | uVar77 * 0x800000)) +
             (uVar77 & uVar84 ^ (uVar77 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[1] + uVar45
    ;
    uVar79 = uVar79 + lVar76;
    uVar80 = lVar76 + ((uVar78 >> 0x1c | uVar78 << 0x24) ^ (uVar78 >> 0x22 | uVar78 * 0x40000000) ^
                      (uVar78 >> 0x27 | uVar78 * 0x2000000)) +
                      (uVar78 & uVar83 ^ uVar78 & uVar81 ^ uVar83 & uVar81);
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar77 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[2] + uVar47
    ;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar80 >> 0x1c | uVar80 << 0x24) ^ (uVar80 >> 0x22 | uVar80 * 0x40000000) ^
                      (uVar80 >> 0x27 | uVar80 * 0x2000000)) +
                      (uVar80 & uVar78 ^ uVar80 & uVar83 ^ uVar78 & uVar83);
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar77) + sha2_512_words[3] + uVar49
    ;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar80 ^ uVar82 & uVar78 ^ uVar80 & uVar78);
    lVar76 = uVar77 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[4] + uVar51
    ;
    uVar78 = uVar78 + lVar76;
    uVar77 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar80 ^ uVar82 & uVar80);
    lVar76 = uVar79 + ((uVar78 >> 0xe | uVar78 << 0x32) ^ (uVar78 >> 0x12 | uVar78 << 0x2e) ^
                      (uVar78 >> 0x29 | uVar78 * 0x800000)) +
             (uVar78 & uVar83 ^ (uVar78 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[5] + uVar53
    ;
    uVar80 = uVar80 + lVar76;
    uVar79 = lVar76 + ((uVar77 >> 0x1c | uVar77 << 0x24) ^ (uVar77 >> 0x22 | uVar77 * 0x40000000) ^
                      (uVar77 >> 0x27 | uVar77 * 0x2000000)) +
                      (uVar77 & uVar84 ^ uVar77 & uVar82 ^ uVar84 & uVar82);
    lVar76 = uVar81 + ((uVar80 >> 0xe | uVar80 << 0x32) ^ (uVar80 >> 0x12 | uVar80 << 0x2e) ^
                      (uVar80 >> 0x29 | uVar80 * 0x800000)) +
             (uVar80 & uVar78 ^ (uVar80 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[6] + uVar55
    ;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar77 ^ uVar79 & uVar84 ^ uVar77 & uVar84);
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar80 ^ (uVar82 ^ 0xffffffffffffffff) & uVar78) + sha2_512_words[7] + uVar57
    ;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar77 ^ uVar79 & uVar77);
    lVar76 = uVar78 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar80) + sha2_512_words[8] + uVar59
    ;
    uVar77 = uVar77 + lVar76;
    uVar78 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    lVar76 = uVar80 + ((uVar77 >> 0xe | uVar77 << 0x32) ^ (uVar77 >> 0x12 | uVar77 << 0x2e) ^
                      (uVar77 >> 0x29 | uVar77 * 0x800000)) +
             (uVar77 & uVar84 ^ (uVar77 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[9] + uVar61
    ;
    uVar79 = uVar79 + lVar76;
    uVar80 = lVar76 + ((uVar78 >> 0x1c | uVar78 << 0x24) ^ (uVar78 >> 0x22 | uVar78 * 0x40000000) ^
                      (uVar78 >> 0x27 | uVar78 * 0x2000000)) +
                      (uVar78 & uVar83 ^ uVar78 & uVar81 ^ uVar83 & uVar81);
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar77 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[10] +
             uVar63;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar80 >> 0x1c | uVar80 << 0x24) ^ (uVar80 >> 0x22 | uVar80 * 0x40000000) ^
                      (uVar80 >> 0x27 | uVar80 * 0x2000000)) +
                      (uVar80 & uVar78 ^ uVar80 & uVar83 ^ uVar78 & uVar83);
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar77) + sha2_512_words[0xb] +
             uVar65;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar80 ^ uVar82 & uVar78 ^ uVar80 & uVar78);
    lVar76 = uVar77 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0xc] +
             uVar67;
    uVar78 = uVar78 + lVar76;
    uVar77 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar80 ^ uVar82 & uVar80);
    lVar76 = uVar79 + ((uVar78 >> 0xe | uVar78 << 0x32) ^ (uVar78 >> 0x12 | uVar78 << 0x2e) ^
                      (uVar78 >> 0x29 | uVar78 * 0x800000)) +
             (uVar78 & uVar83 ^ (uVar78 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0xd] +
             uVar69;
    uVar80 = uVar80 + lVar76;
    uVar79 = lVar76 + ((uVar77 >> 0x1c | uVar77 << 0x24) ^ (uVar77 >> 0x22 | uVar77 * 0x40000000) ^
                      (uVar77 >> 0x27 | uVar77 * 0x2000000)) +
                      (uVar77 & uVar84 ^ uVar77 & uVar82 ^ uVar84 & uVar82);
    lVar76 = uVar81 + ((uVar80 >> 0xe | uVar80 << 0x32) ^ (uVar80 >> 0x12 | uVar80 << 0x2e) ^
                      (uVar80 >> 0x29 | uVar80 * 0x800000)) +
             (uVar80 & uVar78 ^ (uVar80 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0xe] +
             uVar72;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar77 ^ uVar79 & uVar84 ^ uVar77 & uVar84);
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar80 ^ (uVar82 ^ 0xffffffffffffffff) & uVar78) + sha2_512_words[0xf] +
             uVar75;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar77 ^ uVar79 & uVar77);
    uVar43 = ((uVar70 >> 0x13 | uVar72 << 0x2d) ^
              (((ulong)data[0x70] << 0x38) >> 0x3d | uVar72 << 3) ^ uVar72 >> 6) + uVar61 +
             ((uVar45 >> 1 | uVar85 << 0x3f) ^ (uVar44 >> 8 | uVar85 << 0x38) ^ uVar45 >> 7) +
             uVar43;
    lVar76 = uVar78 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar80) + sha2_512_words[0x10] +
             uVar43;
    uVar77 = uVar77 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar45 = ((uVar73 >> 0x13 | uVar75 << 0x2d) ^
              (((ulong)data[0x78] << 0x38) >> 0x3d | uVar75 << 3) ^ uVar75 >> 6) + uVar63 +
             ((uVar47 >> 1 | uVar86 << 0x3f) ^ (uVar46 >> 8 | uVar86 << 0x38) ^ uVar47 >> 7) +
             uVar45;
    lVar76 = uVar80 + ((uVar77 >> 0xe | uVar77 << 0x32) ^ (uVar77 >> 0x12 | uVar77 << 0x2e) ^
                      (uVar77 >> 0x29 | uVar77 * 0x800000)) +
             (uVar77 & uVar84 ^ (uVar77 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x11] +
             uVar45;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar47 = ((uVar43 >> 0x13 | uVar43 << 0x2d) ^ (uVar43 >> 0x3d | uVar43 * 8) ^ uVar43 >> 6) +
             uVar65 + ((uVar49 >> 1 | uVar87 << 0x3f) ^ (uVar48 >> 8 | uVar87 << 0x38) ^ uVar49 >> 7
                      ) + uVar47;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar77 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x12] +
             uVar47;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar49 = ((uVar45 >> 0x13 | uVar45 << 0x2d) ^ (uVar45 >> 0x3d | uVar45 * 8) ^ uVar45 >> 6) +
             uVar67 + ((uVar51 >> 1 | uVar88 << 0x3f) ^ (uVar50 >> 8 | uVar88 << 0x38) ^ uVar51 >> 7
                      ) + uVar49;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar77) + sha2_512_words[0x13] +
             uVar49;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar51 = ((uVar47 >> 0x13 | uVar47 << 0x2d) ^ (uVar47 >> 0x3d | uVar47 * 8) ^ uVar47 >> 6) +
             uVar69 + ((uVar53 >> 1 | uVar89 << 0x3f) ^ (uVar52 >> 8 | uVar89 << 0x38) ^ uVar53 >> 7
                      ) + uVar51;
    lVar76 = uVar77 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x14] +
             uVar51;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar53 = ((uVar49 >> 0x13 | uVar49 << 0x2d) ^ (uVar49 >> 0x3d | uVar49 * 8) ^ uVar49 >> 6) +
             uVar72 + ((uVar55 >> 1 | uVar90 << 0x3f) ^ (uVar54 >> 8 | uVar90 << 0x38) ^ uVar55 >> 7
                      ) + uVar53;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x15] +
             uVar53;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar55 = ((uVar51 >> 0x13 | uVar51 << 0x2d) ^ (uVar51 >> 0x3d | uVar51 * 8) ^ uVar51 >> 6) +
             uVar75 + ((uVar57 >> 1 | uVar91 << 0x3f) ^ (uVar56 >> 8 | uVar91 << 0x38) ^ uVar57 >> 7
                      ) + uVar55;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x16] +
             uVar55;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar57 = ((uVar53 >> 0x13 | uVar53 << 0x2d) ^ (uVar53 >> 0x3d | uVar53 * 8) ^ uVar53 >> 6) +
             uVar43 + ((uVar59 >> 1 | uVar92 << 0x3f) ^ (uVar58 >> 8 | uVar92 << 0x38) ^ uVar59 >> 7
                      ) + uVar57;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x17] +
             uVar57;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar59 = ((uVar55 >> 0x13 | uVar55 << 0x2d) ^ (uVar55 >> 0x3d | uVar55 * 8) ^ uVar55 >> 6) +
             uVar45 + ((uVar61 >> 1 | uVar93 << 0x3f) ^ (uVar60 >> 8 | uVar93 << 0x38) ^ uVar61 >> 7
                      ) + uVar59;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x18] +
             uVar59;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar61 = ((uVar57 >> 0x13 | uVar57 << 0x2d) ^ (uVar57 >> 0x3d | uVar57 * 8) ^ uVar57 >> 6) +
             uVar47 + ((uVar63 >> 1 | uVar94 << 0x3f) ^ (uVar62 >> 8 | uVar94 << 0x38) ^ uVar63 >> 7
                      ) + uVar61;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x19] +
             uVar61;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar63 = ((uVar59 >> 0x13 | uVar59 << 0x2d) ^ (uVar59 >> 0x3d | uVar59 * 8) ^ uVar59 >> 6) +
             uVar49 + ((uVar65 >> 1 | uVar95 << 0x3f) ^ (uVar64 >> 8 | uVar95 << 0x38) ^ uVar65 >> 7
                      ) + uVar63;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x1a] +
             uVar63;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar65 = ((uVar61 >> 0x13 | uVar61 << 0x2d) ^ (uVar61 >> 0x3d | uVar61 * 8) ^ uVar61 >> 6) +
             uVar51 + ((uVar67 >> 1 | uVar96 << 0x3f) ^ (uVar66 >> 8 | uVar96 << 0x38) ^ uVar67 >> 7
                      ) + uVar65;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x1b] +
             uVar65;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar67 = ((uVar63 >> 0x13 | uVar63 << 0x2d) ^ (uVar63 >> 0x3d | uVar63 * 8) ^ uVar63 >> 6) +
             uVar53 + ((uVar69 >> 1 | uVar97 << 0x3f) ^ (uVar68 >> 8 | uVar97 << 0x38) ^ uVar69 >> 7
                      ) + uVar67;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x1c] +
             uVar67;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar69 = ((uVar65 >> 0x13 | uVar65 << 0x2d) ^ (uVar65 >> 0x3d | uVar65 * 8) ^ uVar65 >> 6) +
             uVar55 + ((uVar72 >> 1 | uVar98 << 0x3f) ^ (uVar71 >> 8 | uVar98 << 0x38) ^ uVar72 >> 7
                      ) + uVar69;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x1d] +
             uVar69;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar72 = ((uVar67 >> 0x13 | uVar67 << 0x2d) ^ (uVar67 >> 0x3d | uVar67 * 8) ^ uVar67 >> 6) +
             uVar57 + ((uVar75 >> 1 | uVar99 << 0x3f) ^ (uVar74 >> 8 | uVar99 << 0x38) ^ uVar75 >> 7
                      ) + uVar72;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x1e] +
             uVar72;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar75 = ((uVar69 >> 0x13 | uVar69 << 0x2d) ^ (uVar69 >> 0x3d | uVar69 * 8) ^ uVar69 >> 6) +
             uVar59 + ((uVar43 >> 1 | uVar43 << 0x3f) ^ (uVar43 >> 8 | uVar43 << 0x38) ^ uVar43 >> 7
                      ) + uVar75;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x1f] +
             uVar75;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar43 = ((uVar72 >> 0x13 | uVar72 << 0x2d) ^ (uVar72 >> 0x3d | uVar72 * 8) ^ uVar72 >> 6) +
             uVar61 + ((uVar45 >> 1 | uVar45 << 0x3f) ^ (uVar45 >> 8 | uVar45 << 0x38) ^ uVar45 >> 7
                      ) + uVar43;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x20] +
             uVar43;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar45 = ((uVar75 >> 0x13 | uVar75 << 0x2d) ^ (uVar75 >> 0x3d | uVar75 * 8) ^ uVar75 >> 6) +
             uVar63 + ((uVar47 >> 1 | uVar47 << 0x3f) ^ (uVar47 >> 8 | uVar47 << 0x38) ^ uVar47 >> 7
                      ) + uVar45;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x21] +
             uVar45;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar47 = ((uVar43 >> 0x13 | uVar43 << 0x2d) ^ (uVar43 >> 0x3d | uVar43 * 8) ^ uVar43 >> 6) +
             uVar65 + ((uVar49 >> 1 | uVar49 << 0x3f) ^ (uVar49 >> 8 | uVar49 << 0x38) ^ uVar49 >> 7
                      ) + uVar47;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x22] +
             uVar47;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar49 = ((uVar45 >> 0x13 | uVar45 << 0x2d) ^ (uVar45 >> 0x3d | uVar45 * 8) ^ uVar45 >> 6) +
             uVar67 + ((uVar51 >> 1 | uVar51 << 0x3f) ^ (uVar51 >> 8 | uVar51 << 0x38) ^ uVar51 >> 7
                      ) + uVar49;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x23] +
             uVar49;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar51 = ((uVar47 >> 0x13 | uVar47 << 0x2d) ^ (uVar47 >> 0x3d | uVar47 * 8) ^ uVar47 >> 6) +
             uVar69 + ((uVar53 >> 1 | uVar53 << 0x3f) ^ (uVar53 >> 8 | uVar53 << 0x38) ^ uVar53 >> 7
                      ) + uVar51;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x24] +
             uVar51;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar53 = ((uVar49 >> 0x13 | uVar49 << 0x2d) ^ (uVar49 >> 0x3d | uVar49 * 8) ^ uVar49 >> 6) +
             uVar72 + ((uVar55 >> 1 | uVar55 << 0x3f) ^ (uVar55 >> 8 | uVar55 << 0x38) ^ uVar55 >> 7
                      ) + uVar53;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x25] +
             uVar53;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar55 = ((uVar51 >> 0x13 | uVar51 << 0x2d) ^ (uVar51 >> 0x3d | uVar51 * 8) ^ uVar51 >> 6) +
             uVar75 + ((uVar57 >> 1 | uVar57 << 0x3f) ^ (uVar57 >> 8 | uVar57 << 0x38) ^ uVar57 >> 7
                      ) + uVar55;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x26] +
             uVar55;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar57 = ((uVar53 >> 0x13 | uVar53 << 0x2d) ^ (uVar53 >> 0x3d | uVar53 * 8) ^ uVar53 >> 6) +
             uVar43 + ((uVar59 >> 1 | uVar59 << 0x3f) ^ (uVar59 >> 8 | uVar59 << 0x38) ^ uVar59 >> 7
                      ) + uVar57;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x27] +
             uVar57;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar59 = ((uVar55 >> 0x13 | uVar55 << 0x2d) ^ (uVar55 >> 0x3d | uVar55 * 8) ^ uVar55 >> 6) +
             uVar45 + ((uVar61 >> 1 | uVar61 << 0x3f) ^ (uVar61 >> 8 | uVar61 << 0x38) ^ uVar61 >> 7
                      ) + uVar59;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x28] +
             uVar59;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar61 = ((uVar57 >> 0x13 | uVar57 << 0x2d) ^ (uVar57 >> 0x3d | uVar57 * 8) ^ uVar57 >> 6) +
             uVar47 + ((uVar63 >> 1 | uVar63 << 0x3f) ^ (uVar63 >> 8 | uVar63 << 0x38) ^ uVar63 >> 7
                      ) + uVar61;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x29] +
             uVar61;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar63 = ((uVar59 >> 0x13 | uVar59 << 0x2d) ^ (uVar59 >> 0x3d | uVar59 * 8) ^ uVar59 >> 6) +
             uVar49 + ((uVar65 >> 1 | uVar65 << 0x3f) ^ (uVar65 >> 8 | uVar65 << 0x38) ^ uVar65 >> 7
                      ) + uVar63;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x2a] +
             uVar63;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar65 = ((uVar61 >> 0x13 | uVar61 << 0x2d) ^ (uVar61 >> 0x3d | uVar61 * 8) ^ uVar61 >> 6) +
             uVar51 + ((uVar67 >> 1 | uVar67 << 0x3f) ^ (uVar67 >> 8 | uVar67 << 0x38) ^ uVar67 >> 7
                      ) + uVar65;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x2b] +
             uVar65;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar67 = ((uVar63 >> 0x13 | uVar63 << 0x2d) ^ (uVar63 >> 0x3d | uVar63 * 8) ^ uVar63 >> 6) +
             uVar53 + ((uVar69 >> 1 | uVar69 << 0x3f) ^ (uVar69 >> 8 | uVar69 << 0x38) ^ uVar69 >> 7
                      ) + uVar67;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x2c] +
             uVar67;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar69 = ((uVar65 >> 0x13 | uVar65 << 0x2d) ^ (uVar65 >> 0x3d | uVar65 * 8) ^ uVar65 >> 6) +
             uVar55 + ((uVar72 >> 1 | uVar72 << 0x3f) ^ (uVar72 >> 8 | uVar72 << 0x38) ^ uVar72 >> 7
                      ) + uVar69;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x2d] +
             uVar69;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar72 = ((uVar67 >> 0x13 | uVar67 << 0x2d) ^ (uVar67 >> 0x3d | uVar67 * 8) ^ uVar67 >> 6) +
             uVar57 + ((uVar75 >> 1 | uVar75 << 0x3f) ^ (uVar75 >> 8 | uVar75 << 0x38) ^ uVar75 >> 7
                      ) + uVar72;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x2e] +
             uVar72;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar75 = ((uVar69 >> 0x13 | uVar69 << 0x2d) ^ (uVar69 >> 0x3d | uVar69 * 8) ^ uVar69 >> 6) +
             uVar59 + ((uVar43 >> 1 | uVar43 << 0x3f) ^ (uVar43 >> 8 | uVar43 << 0x38) ^ uVar43 >> 7
                      ) + uVar75;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x2f] +
             uVar75;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar43 = ((uVar72 >> 0x13 | uVar72 << 0x2d) ^ (uVar72 >> 0x3d | uVar72 * 8) ^ uVar72 >> 6) +
             uVar61 + ((uVar45 >> 1 | uVar45 << 0x3f) ^ (uVar45 >> 8 | uVar45 << 0x38) ^ uVar45 >> 7
                      ) + uVar43;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x30] +
             uVar43;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar45 = ((uVar75 >> 0x13 | uVar75 << 0x2d) ^ (uVar75 >> 0x3d | uVar75 * 8) ^ uVar75 >> 6) +
             uVar63 + ((uVar47 >> 1 | uVar47 << 0x3f) ^ (uVar47 >> 8 | uVar47 << 0x38) ^ uVar47 >> 7
                      ) + uVar45;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x31] +
             uVar45;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar47 = ((uVar43 >> 0x13 | uVar43 << 0x2d) ^ (uVar43 >> 0x3d | uVar43 * 8) ^ uVar43 >> 6) +
             uVar65 + ((uVar49 >> 1 | uVar49 << 0x3f) ^ (uVar49 >> 8 | uVar49 << 0x38) ^ uVar49 >> 7
                      ) + uVar47;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x32] +
             uVar47;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar49 = ((uVar45 >> 0x13 | uVar45 << 0x2d) ^ (uVar45 >> 0x3d | uVar45 * 8) ^ uVar45 >> 6) +
             uVar67 + ((uVar51 >> 1 | uVar51 << 0x3f) ^ (uVar51 >> 8 | uVar51 << 0x38) ^ uVar51 >> 7
                      ) + uVar49;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x33] +
             uVar49;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar51 = ((uVar47 >> 0x13 | uVar47 << 0x2d) ^ (uVar47 >> 0x3d | uVar47 * 8) ^ uVar47 >> 6) +
             uVar69 + ((uVar53 >> 1 | uVar53 << 0x3f) ^ (uVar53 >> 8 | uVar53 << 0x38) ^ uVar53 >> 7
                      ) + uVar51;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x34] +
             uVar51;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar53 = ((uVar49 >> 0x13 | uVar49 << 0x2d) ^ (uVar49 >> 0x3d | uVar49 * 8) ^ uVar49 >> 6) +
             uVar72 + ((uVar55 >> 1 | uVar55 << 0x3f) ^ (uVar55 >> 8 | uVar55 << 0x38) ^ uVar55 >> 7
                      ) + uVar53;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x35] +
             uVar53;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar55 = ((uVar51 >> 0x13 | uVar51 << 0x2d) ^ (uVar51 >> 0x3d | uVar51 * 8) ^ uVar51 >> 6) +
             uVar75 + ((uVar57 >> 1 | uVar57 << 0x3f) ^ (uVar57 >> 8 | uVar57 << 0x38) ^ uVar57 >> 7
                      ) + uVar55;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x36] +
             uVar55;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar57 = ((uVar53 >> 0x13 | uVar53 << 0x2d) ^ (uVar53 >> 0x3d | uVar53 * 8) ^ uVar53 >> 6) +
             uVar43 + ((uVar59 >> 1 | uVar59 << 0x3f) ^ (uVar59 >> 8 | uVar59 << 0x38) ^ uVar59 >> 7
                      ) + uVar57;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x37] +
             uVar57;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar59 = ((uVar55 >> 0x13 | uVar55 << 0x2d) ^ (uVar55 >> 0x3d | uVar55 * 8) ^ uVar55 >> 6) +
             uVar45 + ((uVar61 >> 1 | uVar61 << 0x3f) ^ (uVar61 >> 8 | uVar61 << 0x38) ^ uVar61 >> 7
                      ) + uVar59;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x38] +
             uVar59;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar61 = ((uVar57 >> 0x13 | uVar57 << 0x2d) ^ (uVar57 >> 0x3d | uVar57 * 8) ^ uVar57 >> 6) +
             uVar47 + ((uVar63 >> 1 | uVar63 << 0x3f) ^ (uVar63 >> 8 | uVar63 << 0x38) ^ uVar63 >> 7
                      ) + uVar61;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x39] +
             uVar61;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar63 = ((uVar59 >> 0x13 | uVar59 << 0x2d) ^ (uVar59 >> 0x3d | uVar59 * 8) ^ uVar59 >> 6) +
             uVar49 + ((uVar65 >> 1 | uVar65 << 0x3f) ^ (uVar65 >> 8 | uVar65 << 0x38) ^ uVar65 >> 7
                      ) + uVar63;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x3a] +
             uVar63;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar65 = ((uVar61 >> 0x13 | uVar61 << 0x2d) ^ (uVar61 >> 0x3d | uVar61 * 8) ^ uVar61 >> 6) +
             uVar51 + ((uVar67 >> 1 | uVar67 << 0x3f) ^ (uVar67 >> 8 | uVar67 << 0x38) ^ uVar67 >> 7
                      ) + uVar65;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x3b] +
             uVar65;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar67 = ((uVar63 >> 0x13 | uVar63 << 0x2d) ^ (uVar63 >> 0x3d | uVar63 * 8) ^ uVar63 >> 6) +
             uVar53 + ((uVar69 >> 1 | uVar69 << 0x3f) ^ (uVar69 >> 8 | uVar69 << 0x38) ^ uVar69 >> 7
                      ) + uVar67;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x3c] +
             uVar67;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar69 = ((uVar65 >> 0x13 | uVar65 << 0x2d) ^ (uVar65 >> 0x3d | uVar65 * 8) ^ uVar65 >> 6) +
             uVar55 + ((uVar72 >> 1 | uVar72 << 0x3f) ^ (uVar72 >> 8 | uVar72 << 0x38) ^ uVar72 >> 7
                      ) + uVar69;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x3d] +
             uVar69;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar72 = ((uVar67 >> 0x13 | uVar67 << 0x2d) ^ (uVar67 >> 0x3d | uVar67 * 8) ^ uVar67 >> 6) +
             uVar57 + ((uVar75 >> 1 | uVar75 << 0x3f) ^ (uVar75 >> 8 | uVar75 << 0x38) ^ uVar75 >> 7
                      ) + uVar72;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x3e] +
             uVar72;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar75 = ((uVar69 >> 0x13 | uVar69 << 0x2d) ^ (uVar69 >> 0x3d | uVar69 * 8) ^ uVar69 >> 6) +
             uVar59 + ((uVar43 >> 1 | uVar43 << 0x3f) ^ (uVar43 >> 8 | uVar43 << 0x38) ^ uVar43 >> 7
                      ) + uVar75;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x3f] +
             uVar75;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar43 = ((uVar72 >> 0x13 | uVar72 << 0x2d) ^ (uVar72 >> 0x3d | uVar72 * 8) ^ uVar72 >> 6) +
             uVar61 + ((uVar45 >> 1 | uVar45 << 0x3f) ^ (uVar45 >> 8 | uVar45 << 0x38) ^ uVar45 >> 7
                      ) + uVar43;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x40] +
             uVar43;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar45 = ((uVar75 >> 0x13 | uVar75 << 0x2d) ^ (uVar75 >> 0x3d | uVar75 * 8) ^ uVar75 >> 6) +
             uVar63 + ((uVar47 >> 1 | uVar47 << 0x3f) ^ (uVar47 >> 8 | uVar47 << 0x38) ^ uVar47 >> 7
                      ) + uVar45;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x41] +
             uVar45;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar47 = ((uVar43 >> 0x13 | uVar43 << 0x2d) ^ (uVar43 >> 0x3d | uVar43 * 8) ^ uVar43 >> 6) +
             uVar65 + ((uVar49 >> 1 | uVar49 << 0x3f) ^ (uVar49 >> 8 | uVar49 << 0x38) ^ uVar49 >> 7
                      ) + uVar47;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x42] +
             uVar47;
    uVar81 = uVar81 + lVar76;
    uVar82 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar49 = ((uVar45 >> 0x13 | uVar45 << 0x2d) ^ (uVar45 >> 0x3d | uVar45 * 8) ^ uVar45 >> 6) +
             uVar67 + ((uVar51 >> 1 | uVar51 << 0x3f) ^ (uVar51 >> 8 | uVar51 << 0x38) ^ uVar51 >> 7
                      ) + uVar49;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x43] +
             uVar49;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar46 ^ uVar82 & uVar44 ^ uVar46 & uVar44);
    uVar51 = ((uVar47 >> 0x13 | uVar47 << 0x2d) ^ (uVar47 >> 0x3d | uVar47 * 8) ^ uVar47 >> 6) +
             uVar69 + ((uVar53 >> 1 | uVar53 << 0x3f) ^ (uVar53 >> 8 | uVar53 << 0x38) ^ uVar53 >> 7
                      ) + uVar51;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x44] +
             uVar51;
    uVar44 = uVar44 + lVar76;
    uVar48 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar82 ^ uVar84 & uVar46 ^ uVar82 & uVar46);
    uVar53 = ((uVar49 >> 0x13 | uVar49 << 0x2d) ^ (uVar49 >> 0x3d | uVar49 * 8) ^ uVar49 >> 6) +
             uVar72 + ((uVar55 >> 1 | uVar55 << 0x3f) ^ (uVar55 >> 8 | uVar55 << 0x38) ^ uVar55 >> 7
                      ) + uVar53;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x45] +
             uVar53;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar48 >> 0x1c | uVar48 << 0x24) ^ (uVar48 >> 0x22 | uVar48 * 0x40000000) ^
                      (uVar48 >> 0x27 | uVar48 * 0x2000000)) +
                      (uVar48 & uVar84 ^ uVar48 & uVar82 ^ uVar84 & uVar82);
    uVar55 = ((uVar51 >> 0x13 | uVar51 << 0x2d) ^ (uVar51 >> 0x3d | uVar51 * 8) ^ uVar51 >> 6) +
             uVar75 + ((uVar57 >> 1 | uVar57 << 0x3f) ^ (uVar57 >> 8 | uVar57 << 0x38) ^ uVar57 >> 7
                      ) + uVar55;
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x46] +
             uVar55;
    uVar82 = uVar82 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar48 ^ uVar79 & uVar84 ^ uVar48 & uVar84);
    uVar57 = ((uVar53 >> 0x13 | uVar53 << 0x2d) ^ (uVar53 >> 0x3d | uVar53 * 8) ^ uVar53 >> 6) +
             uVar43 + ((uVar59 >> 1 | uVar59 << 0x3f) ^ (uVar59 >> 8 | uVar59 << 0x38) ^ uVar59 >> 7
                      ) + uVar57;
    lVar76 = uVar83 + ((uVar82 >> 0xe | uVar82 << 0x32) ^ (uVar82 >> 0x12 | uVar82 << 0x2e) ^
                      (uVar82 >> 0x29 | uVar82 * 0x800000)) +
             (uVar82 & uVar46 ^ (uVar82 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x47] +
             uVar57;
    uVar84 = uVar84 + lVar76;
    uVar83 = lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                      (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                      (uVar81 & uVar79 ^ uVar81 & uVar48 ^ uVar79 & uVar48);
    uVar59 = ((uVar55 >> 0x13 | uVar55 << 0x2d) ^ (uVar55 >> 0x3d | uVar55 * 8) ^ uVar55 >> 6) +
             uVar45 + ((uVar61 >> 1 | uVar61 << 0x3f) ^ (uVar61 >> 8 | uVar61 << 0x38) ^ uVar61 >> 7
                      ) + uVar59;
    lVar76 = uVar44 + ((uVar84 >> 0xe | uVar84 << 0x32) ^ (uVar84 >> 0x12 | uVar84 << 0x2e) ^
                      (uVar84 >> 0x29 | uVar84 * 0x800000)) +
             (uVar84 & uVar82 ^ (uVar84 ^ 0xffffffffffffffff) & uVar46) + sha2_512_words[0x48] +
             uVar59;
    uVar48 = uVar48 + lVar76;
    uVar44 = lVar76 + ((uVar83 >> 0x1c | uVar83 << 0x24) ^ (uVar83 >> 0x22 | uVar83 * 0x40000000) ^
                      (uVar83 >> 0x27 | uVar83 * 0x2000000)) +
                      (uVar83 & uVar81 ^ uVar83 & uVar79 ^ uVar81 & uVar79);
    uVar61 = ((uVar57 >> 0x13 | uVar57 << 0x2d) ^ (uVar57 >> 0x3d | uVar57 * 8) ^ uVar57 >> 6) +
             uVar47 + ((uVar63 >> 1 | uVar63 << 0x3f) ^ (uVar63 >> 8 | uVar63 << 0x38) ^ uVar63 >> 7
                      ) + uVar61;
    lVar76 = uVar46 + ((uVar48 >> 0xe | uVar48 << 0x32) ^ (uVar48 >> 0x12 | uVar48 << 0x2e) ^
                      (uVar48 >> 0x29 | uVar48 * 0x800000)) +
             (uVar48 & uVar84 ^ (uVar48 ^ 0xffffffffffffffff) & uVar82) + sha2_512_words[0x49] +
             uVar61;
    uVar79 = uVar79 + lVar76;
    uVar46 = lVar76 + ((uVar44 >> 0x1c | uVar44 << 0x24) ^ (uVar44 >> 0x22 | uVar44 * 0x40000000) ^
                      (uVar44 >> 0x27 | uVar44 * 0x2000000)) +
                      (uVar44 & uVar83 ^ uVar44 & uVar81 ^ uVar83 & uVar81);
    uVar63 = ((uVar59 >> 0x13 | uVar59 << 0x2d) ^ (uVar59 >> 0x3d | uVar59 * 8) ^ uVar59 >> 6) +
             uVar49 + ((uVar65 >> 1 | uVar65 << 0x3f) ^ (uVar65 >> 8 | uVar65 << 0x38) ^ uVar65 >> 7
                      ) + uVar63;
    lVar76 = uVar82 + ((uVar79 >> 0xe | uVar79 << 0x32) ^ (uVar79 >> 0x12 | uVar79 << 0x2e) ^
                      (uVar79 >> 0x29 | uVar79 * 0x800000)) +
             (uVar79 & uVar48 ^ (uVar79 ^ 0xffffffffffffffff) & uVar84) + sha2_512_words[0x4a] +
             uVar63;
    uVar81 = uVar81 + lVar76;
    uVar50 = lVar76 + ((uVar46 >> 0x1c | uVar46 << 0x24) ^ (uVar46 >> 0x22 | uVar46 * 0x40000000) ^
                      (uVar46 >> 0x27 | uVar46 * 0x2000000)) +
                      (uVar46 & uVar44 ^ uVar46 & uVar83 ^ uVar44 & uVar83);
    uVar65 = ((uVar61 >> 0x13 | uVar61 << 0x2d) ^ (uVar61 >> 0x3d | uVar61 * 8) ^ uVar61 >> 6) +
             uVar51 + ((uVar67 >> 1 | uVar67 << 0x3f) ^ (uVar67 >> 8 | uVar67 << 0x38) ^ uVar67 >> 7
                      ) + uVar65;
    lVar76 = uVar84 + ((uVar81 >> 0xe | uVar81 << 0x32) ^ (uVar81 >> 0x12 | uVar81 << 0x2e) ^
                      (uVar81 >> 0x29 | uVar81 * 0x800000)) +
             (uVar81 & uVar79 ^ (uVar81 ^ 0xffffffffffffffff) & uVar48) + sha2_512_words[0x4b] +
             uVar65;
    uVar83 = uVar83 + lVar76;
    uVar84 = lVar76 + ((uVar50 >> 0x1c | uVar50 << 0x24) ^ (uVar50 >> 0x22 | uVar50 * 0x40000000) ^
                      (uVar50 >> 0x27 | uVar50 * 0x2000000)) +
                      (uVar50 & uVar46 ^ uVar50 & uVar44 ^ uVar46 & uVar44);
    uVar67 = ((uVar63 >> 0x13 | uVar63 << 0x2d) ^ (uVar63 >> 0x3d | uVar63 * 8) ^ uVar63 >> 6) +
             uVar53 + ((uVar69 >> 1 | uVar69 << 0x3f) ^ (uVar69 >> 8 | uVar69 << 0x38) ^ uVar69 >> 7
                      ) + uVar67;
    lVar76 = uVar48 + ((uVar83 >> 0xe | uVar83 << 0x32) ^ (uVar83 >> 0x12 | uVar83 << 0x2e) ^
                      (uVar83 >> 0x29 | uVar83 * 0x800000)) +
             (uVar83 & uVar81 ^ (uVar83 ^ 0xffffffffffffffff) & uVar79) + sha2_512_words[0x4c] +
             uVar67;
    uVar44 = uVar44 + lVar76;
    uVar82 = lVar76 + ((uVar84 >> 0x1c | uVar84 << 0x24) ^ (uVar84 >> 0x22 | uVar84 * 0x40000000) ^
                      (uVar84 >> 0x27 | uVar84 * 0x2000000)) +
                      (uVar84 & uVar50 ^ uVar84 & uVar46 ^ uVar50 & uVar46);
    uVar69 = ((uVar65 >> 0x13 | uVar65 << 0x2d) ^ (uVar65 >> 0x3d | uVar65 * 8) ^ uVar65 >> 6) +
             uVar55 + ((uVar72 >> 1 | uVar72 << 0x3f) ^ (uVar72 >> 8 | uVar72 << 0x38) ^ uVar72 >> 7
                      ) + uVar69;
    lVar76 = uVar79 + ((uVar44 >> 0xe | uVar44 << 0x32) ^ (uVar44 >> 0x12 | uVar44 << 0x2e) ^
                      (uVar44 >> 0x29 | uVar44 * 0x800000)) +
             (uVar44 & uVar83 ^ (uVar44 ^ 0xffffffffffffffff) & uVar81) + sha2_512_words[0x4d] +
             uVar69;
    uVar46 = uVar46 + lVar76;
    uVar79 = lVar76 + ((uVar82 >> 0x1c | uVar82 << 0x24) ^ (uVar82 >> 0x22 | uVar82 * 0x40000000) ^
                      (uVar82 >> 0x27 | uVar82 * 0x2000000)) +
                      (uVar82 & uVar84 ^ uVar82 & uVar50 ^ uVar84 & uVar50);
    lVar76 = uVar81 + ((uVar46 >> 0xe | uVar46 << 0x32) ^ (uVar46 >> 0x12 | uVar46 << 0x2e) ^
                      (uVar46 >> 0x29 | uVar46 * 0x800000)) +
             (uVar46 & uVar44 ^ (uVar46 ^ 0xffffffffffffffff) & uVar83) + sha2_512_words[0x4e] +
             ((uVar67 >> 0x13 | uVar67 << 0x2d) ^ (uVar67 >> 0x3d | uVar67 * 8) ^ uVar67 >> 6) +
             uVar57 + ((uVar75 >> 1 | uVar75 << 0x3f) ^ (uVar75 >> 8 | uVar75 << 0x38) ^ uVar75 >> 7
                      ) + uVar72;
    uVar50 = uVar50 + lVar76;
    uVar81 = lVar76 + ((uVar79 >> 0x1c | uVar79 << 0x24) ^ (uVar79 >> 0x22 | uVar79 * 0x40000000) ^
                      (uVar79 >> 0x27 | uVar79 * 0x2000000)) +
                      (uVar79 & uVar82 ^ uVar79 & uVar84 ^ uVar82 & uVar84);
    lVar76 = uVar83 + ((uVar50 >> 0xe | uVar50 << 0x32) ^ (uVar50 >> 0x12 | uVar50 << 0x2e) ^
                      (uVar50 >> 0x29 | uVar50 * 0x800000)) +
             (uVar50 & uVar46 ^ (uVar50 ^ 0xffffffffffffffff) & uVar44) + sha2_512_words[0x4f] +
             ((uVar69 >> 0x13 | uVar69 << 0x2d) ^ (uVar69 >> 0x3d | uVar69 * 8) ^ uVar69 >> 6) +
             uVar59 + ((uVar43 >> 1 | uVar43 << 0x3f) ^ (uVar43 >> 8 | uVar43 << 0x38) ^ uVar43 >> 7
                      ) + uVar75;
    (s->digest).i64[0] =
         lVar76 + ((uVar81 >> 0x1c | uVar81 << 0x24) ^ (uVar81 >> 0x22 | uVar81 * 0x40000000) ^
                  (uVar81 >> 0x27 | uVar81 * 0x2000000)) +
                  (uVar81 & uVar79 ^ uVar81 & uVar82 ^ uVar79 & uVar82) + (s->digest).i64[0];
    (s->digest).i64[1] = uVar81 + (s->digest).i64[1];
    (s->digest).i64[2] = uVar79 + (s->digest).i64[2];
    (s->digest).i64[3] = uVar82 + (s->digest).i64[3];
    (s->digest).i64[4] = uVar84 + lVar76 + (s->digest).i64[4];
    (s->digest).i64[5] = uVar50 + (s->digest).i64[5];
    (s->digest).i64[6] = uVar46 + (s->digest).i64[6];
    (s->digest).i64[7] = uVar44 + (s->digest).i64[7];
  }
  return;
}

Assistant:

static inline void fio_sha2_perform_all_rounds(fio_sha2_s *s,
                                               const uint8_t *data) {
  if (s->type & 1) { /* 512 derived type */
    // process values for the 64bit words
    uint64_t a = s->digest.i64[0];
    uint64_t b = s->digest.i64[1];
    uint64_t c = s->digest.i64[2];
    uint64_t d = s->digest.i64[3];
    uint64_t e = s->digest.i64[4];
    uint64_t f = s->digest.i64[5];
    uint64_t g = s->digest.i64[6];
    uint64_t h = s->digest.i64[7];
    uint64_t t1, t2, w[80];
    w[0] = fio_str2u64(data);
    w[1] = fio_str2u64(data + 8);
    w[2] = fio_str2u64(data + 16);
    w[3] = fio_str2u64(data + 24);
    w[4] = fio_str2u64(data + 32);
    w[5] = fio_str2u64(data + 40);
    w[6] = fio_str2u64(data + 48);
    w[7] = fio_str2u64(data + 56);
    w[8] = fio_str2u64(data + 64);
    w[9] = fio_str2u64(data + 72);
    w[10] = fio_str2u64(data + 80);
    w[11] = fio_str2u64(data + 88);
    w[12] = fio_str2u64(data + 96);
    w[13] = fio_str2u64(data + 104);
    w[14] = fio_str2u64(data + 112);
    w[15] = fio_str2u64(data + 120);

#undef perform_single_round
#define perform_single_round(i)                                                \
  t1 = h + Eps1_64(e) + Ch(e, f, g) + sha2_512_words[i] + w[i];                \
  t2 = Eps0_64(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

#define perform_4rounds(i)                                                     \
  perform_single_round(i);                                                     \
  perform_single_round(i + 1);                                                 \
  perform_single_round(i + 2);                                                 \
  perform_single_round(i + 3);

    perform_4rounds(0);
    perform_4rounds(4);
    perform_4rounds(8);
    perform_4rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[i] = Omg1_64(w[i - 2]) + w[i - 7] + Omg0_64(w[i - 15]) + w[i - 16];        \
  t1 = h + Eps1_64(e) + Ch(e, f, g) + sha2_512_words[i] + w[i];                \
  t2 = Eps0_64(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(16);
    perform_4rounds(20);
    perform_4rounds(24);
    perform_4rounds(28);
    perform_4rounds(32);
    perform_4rounds(36);
    perform_4rounds(40);
    perform_4rounds(44);
    perform_4rounds(48);
    perform_4rounds(52);
    perform_4rounds(56);
    perform_4rounds(60);
    perform_4rounds(64);
    perform_4rounds(68);
    perform_4rounds(72);
    perform_4rounds(76);

    s->digest.i64[0] += a;
    s->digest.i64[1] += b;
    s->digest.i64[2] += c;
    s->digest.i64[3] += d;
    s->digest.i64[4] += e;
    s->digest.i64[5] += f;
    s->digest.i64[6] += g;
    s->digest.i64[7] += h;
    return;
  } else {
    // process values for the 32bit words
    uint32_t a = s->digest.i32[0];
    uint32_t b = s->digest.i32[1];
    uint32_t c = s->digest.i32[2];
    uint32_t d = s->digest.i32[3];
    uint32_t e = s->digest.i32[4];
    uint32_t f = s->digest.i32[5];
    uint32_t g = s->digest.i32[6];
    uint32_t h = s->digest.i32[7];
    uint32_t t1, t2, w[64];

    w[0] = fio_str2u32(data);
    w[1] = fio_str2u32(data + 4);
    w[2] = fio_str2u32(data + 8);
    w[3] = fio_str2u32(data + 12);
    w[4] = fio_str2u32(data + 16);
    w[5] = fio_str2u32(data + 20);
    w[6] = fio_str2u32(data + 24);
    w[7] = fio_str2u32(data + 28);
    w[8] = fio_str2u32(data + 32);
    w[9] = fio_str2u32(data + 36);
    w[10] = fio_str2u32(data + 40);
    w[11] = fio_str2u32(data + 44);
    w[12] = fio_str2u32(data + 48);
    w[13] = fio_str2u32(data + 52);
    w[14] = fio_str2u32(data + 56);
    w[15] = fio_str2u32(data + 60);

#undef perform_single_round
#define perform_single_round(i)                                                \
  t1 = h + Eps1_32(e) + Ch(e, f, g) + sha2_256_words[i] + w[i];                \
  t2 = Eps0_32(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(0);
    perform_4rounds(4);
    perform_4rounds(8);
    perform_4rounds(12);

#undef perform_single_round
#define perform_single_round(i)                                                \
  w[i] = Omg1_32(w[i - 2]) + w[i - 7] + Omg0_32(w[i - 15]) + w[i - 16];        \
  t1 = h + Eps1_32(e) + Ch(e, f, g) + sha2_256_words[i] + w[i];                \
  t2 = Eps0_32(a) + Maj(a, b, c);                                              \
  h = g;                                                                       \
  g = f;                                                                       \
  f = e;                                                                       \
  e = d + t1;                                                                  \
  d = c;                                                                       \
  c = b;                                                                       \
  b = a;                                                                       \
  a = t1 + t2;

    perform_4rounds(16);
    perform_4rounds(20);
    perform_4rounds(24);
    perform_4rounds(28);
    perform_4rounds(32);
    perform_4rounds(36);
    perform_4rounds(40);
    perform_4rounds(44);
    perform_4rounds(48);
    perform_4rounds(52);
    perform_4rounds(56);
    perform_4rounds(60);

    s->digest.i32[0] += a;
    s->digest.i32[1] += b;
    s->digest.i32[2] += c;
    s->digest.i32[3] += d;
    s->digest.i32[4] += e;
    s->digest.i32[5] += f;
    s->digest.i32[6] += g;
    s->digest.i32[7] += h;
  }
}